

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_typed_array_constructor
                  (JSContext *ctx,JSValue new_target,int argc,JSValue *argv,int classid)

{
  byte bVar1;
  short sVar2;
  uint uVar3;
  uint *puVar4;
  JSValue ctor;
  bool bVar5;
  JSContext *ctx_00;
  JSValueUnion JVar6;
  uint64_t uVar7;
  int iVar8;
  uint uVar9;
  JSValueUnion JVar10;
  double dVar11;
  int *piVar12;
  double dVar13;
  ulong uVar14;
  char *fmt;
  JSRuntime *rt;
  ulong uVar15;
  int64_t iVar16;
  JSValueUnion JVar17;
  ulong uVar18;
  JSValue obj;
  JSValue obj_00;
  JSValue obj_01;
  JSValue v;
  JSValue v_00;
  JSValue obj_02;
  JSValue this_obj;
  JSValue this_obj_00;
  JSValue v_01;
  JSValue obj_03;
  JSValue this_obj_01;
  JSValue this_obj_02;
  JSValue JVar19;
  JSValue JVar20;
  JSValue JVar21;
  JSValue JVar22;
  JSValue JVar23;
  JSValue buffer;
  JSValue buffer_00;
  JSValue prop;
  JSValue prop_00;
  JSValue buffer_01;
  JSValue prop_01;
  JSValue prop_02;
  JSValue obj_04;
  JSValue obj_05;
  JSValue val;
  JSValue this_obj_03;
  uint64_t len;
  uint64_t offset;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  JSValueUnion local_98 [2];
  double local_88;
  JSContext *local_80;
  JSValueUnion local_78;
  int *local_70;
  uint local_64;
  JSValueUnion local_60;
  ulong local_58;
  uint64_t local_50;
  JSValueUnion local_48;
  JSValueUnion local_40;
  int64_t local_38;
  
  local_38 = new_target.tag;
  local_40 = new_target.u;
  uVar14 = (ulong)(uint)classid;
  bVar1 = "includes"[(long)classid + 1];
  JVar20.tag._1_7_ = 0;
  JVar20.tag._0_1_ = bVar1;
  uVar18 = argv->tag;
  local_64 = classid;
  if ((int)uVar18 == -1) {
    sVar2 = *(short *)((long)(argv->u).ptr + 6);
    uVar15 = uVar18;
    local_80 = ctx;
    if ((ushort)(sVar2 - 0x13U) < 2) {
      puVar4 = *(uint **)((long)(argv->u).ptr + 0x30);
      iVar8 = JS_ToIndex(ctx,&local_50,argv[1]);
      uVar7 = local_50;
      iVar16 = 6;
      if (iVar8 == 0) {
        if ((char)puVar4[1] == '\0') {
          uVar9 = ~(-1 << (bVar1 & 0x1f));
          uVar15 = uVar7;
          if (((uint)local_50 & uVar9) == 0) {
            uVar3 = *puVar4;
            if ((ulong)(long)(int)uVar3 < local_50) goto LAB_0013394f;
            if ((int)argv[2].tag == 3) {
              if ((uVar3 & uVar9) == 0) {
                local_70 = (int *)((long)(int)uVar3 - local_50 >> (bVar1 & 0x3f));
LAB_00133e57:
                JVar20.tag = (JSValueUnion)(argv->u).ptr;
                uVar15 = argv->tag;
                local_98[0].ptr = JVar20.tag;
                if (0xfffffff4 < (uint)uVar15) {
                  *(int *)JVar20.tag = *JVar20.tag + 1;
                }
                bVar5 = true;
                JVar17.float64 = 0.0;
                goto LAB_00133c13;
              }
            }
            else {
              val.tag = argv[2].tag;
              val.u.ptr = argv[2].u.ptr;
              iVar8 = JS_ToIndex(local_80,(uint64_t *)&local_70,val);
              if (iVar8 != 0) goto LAB_0013372e;
              uVar18 = uVar7;
              if ((char)puVar4[1] != '\0') goto LAB_0013383e;
              if (((long)local_70 << (bVar1 & 0x3f)) + uVar7 <= (ulong)(long)(int)*puVar4)
              goto LAB_00133e57;
            }
            fmt = "invalid length";
          }
          else {
LAB_0013394f:
            fmt = "invalid offset";
          }
          JS_ThrowRangeError(local_80,fmt);
        }
        else {
LAB_0013383e:
          JS_ThrowTypeError(local_80,"ArrayBuffer is detached");
          uVar15 = uVar18;
        }
        bVar5 = false;
        JVar17.float64 = 0.0;
        uVar14 = 0;
      }
      else {
LAB_0013372e:
        bVar5 = false;
        JVar17.float64 = 0.0;
      }
    }
    else {
      if ((ushort)(sVar2 - 0x15U) < 9) {
        local_70 = (int *)(argv->u).ptr;
        this_obj_02 = js_create_from_ctor(ctx,new_target,classid);
        JVar17 = this_obj_02.u;
        if ((uint)this_obj_02.tag == 6) {
LAB_00133791:
          uVar14 = (ulong)JVar17.ptr & 0xffffffff00000000;
        }
        else {
          uVar14 = *(ulong *)(local_70 + 0xc);
          JVar10 = (JSValueUnion)
                   ((JSValueUnion *)((long)((JSValueUnion *)(uVar14 + 0x18))->ptr + 0x30))->ptr;
          if (*(char *)((long)JVar10.ptr + 4) == '\0') {
            local_78.ptr = local_70;
            local_88 = (double)(ulong)(uint)local_70[0x10];
            local_60 = JVar10;
            local_58 = uVar14;
            if (*(char *)((long)JVar10.ptr + 5) == '\0') {
              obj_00.tag = -1;
              obj_00.u.ptr = ((JSValueUnion *)(uVar14 + 0x18))->ptr;
              JVar23 = JS_SpeciesConstructor(ctx,obj_00,(JSValue)(ZEXT816(3) << 0x40));
              ctx = local_80;
              if ((int)JVar23.tag != 6) goto LAB_00133a46;
            }
            else {
              JVar23 = (JSValue)(ZEXT816(3) << 0x40);
LAB_00133a46:
              JVar10 = JVar23.u;
              in_stack_ffffffffffffff48 = 0x133348;
              in_stack_ffffffffffffff4c = 0;
              JVar20 = js_array_buffer_constructor3
                                 (ctx,JVar23,(long)local_88 << (bVar1 & 0x3f),0x13,(uint8_t *)0x0,
                                  js_array_buffer_free,(void *)0x0,1);
              local_98[0] = JVar20.u;
              if ((0xfffffff4 < (uint)JVar23.tag) &&
                 (iVar8 = *JVar10.ptr, *(int *)JVar10.ptr = iVar8 + -1, iVar8 < 2)) {
                local_48 = local_98[0];
                local_98[0] = JVar10;
                __JS_FreeValueRT(ctx->rt,JVar23);
                local_98[0] = local_48;
              }
              ctx = local_80;
              if (((ulong)JVar20.tag & 0xffffffff) != 6) {
                if (*(char *)(*(long *)(*(long *)(*(long *)((long)local_78.ptr + 0x30) + 0x18) +
                                       0x30) + 4) != '\0') {
                  if ((0xfffffff4 < (uint)JVar20.tag) &&
                     (iVar8 = *local_98[0].ptr, *(int *)local_98[0].ptr = iVar8 + -1, iVar8 < 2)) {
                    JVar20.u.ptr = local_98[0].ptr;
                    __JS_FreeValueRT(local_80->rt,JVar20);
                  }
                  goto LAB_00133873;
                }
                if ((uint)JVar20.tag == 0xffffffff) {
                  if (*(short *)((long)local_98[0].ptr + 6) == 0x13) {
                    piVar12 = *(int **)((long)local_98[0].ptr + 0x30);
                  }
                  else {
                    piVar12 = (int *)0x0;
                  }
                }
                else {
                  piVar12 = (int *)0x0;
                }
                obj_03.tag = (int64_t)local_98[0].ptr;
                obj_03.u.ptr = JVar17.ptr;
                buffer_01.tag = 0;
                buffer_01.u.float64 = JVar20.tag;
                iVar8 = typed_array_init(local_80,obj_03,buffer_01,(uint64_t)local_88,
                                         CONCAT44(in_stack_ffffffffffffff4c,
                                                  in_stack_ffffffffffffff48));
                if (iVar8 == 0) {
                  if (*(ushort *)((long)local_78.ptr + 6) == local_64) {
                    memcpy(*(void **)(piVar12 + 2),
                           (void *)((ulong)*(uint *)(local_58 + 0x20) +
                                   *(long *)((long)local_60.ptr + 8)),(long)*piVar12);
                  }
                  else if (local_88 != 0.0) {
                    local_78.ptr = local_70;
                    dVar13 = 0.0;
                    do {
                      dVar11 = (double)((ulong)dVar13 & 0xffffffff);
                      if (-1 < SUB84(dVar13,0)) {
                        dVar11 = dVar13;
                      }
                      JVar20.tag._0_4_ = (uint)((ulong)(long)SUB84(dVar13,0) >> 0x1f) & 7;
                      JVar20.tag._4_4_ = 0;
                      this_obj_01.tag = uVar18;
                      this_obj_01.u.float64 = local_78.float64;
                      prop_01.tag._0_4_ = (uint)JVar20.tag;
                      prop_01.u.float64 = dVar11;
                      prop_01.tag._4_4_ = 0;
                      JVar23 = JS_GetPropertyValue(local_80,this_obj_01,prop_01);
                      if ((int)JVar23.tag == 6) goto LAB_00133884;
                      in_stack_ffffffffffffff48 = JVar23.u._0_4_;
                      in_stack_ffffffffffffff4c = JVar23.u._4_4_;
                      prop_02.tag._0_4_ = (uint)JVar20.tag;
                      prop_02.u.float64 = dVar11;
                      prop_02.tag._4_4_ = 0;
                      local_98 = (JSValueUnion  [2])JVar23;
                      iVar8 = JS_SetPropertyValue(local_80,this_obj_02,prop_02,JVar23,0x4000);
                      if (iVar8 < 0) goto LAB_00133884;
                      dVar13 = (double)((long)dVar13 + 1);
                    } while (local_88 != dVar13);
                  }
                  goto LAB_00133791;
                }
              }
            }
          }
          else {
LAB_00133873:
            JS_ThrowTypeError(ctx,"ArrayBuffer is detached");
          }
LAB_00133884:
          local_98[0].ptr = JVar17.ptr;
          if ((0xfffffff4 < (uint)this_obj_02.tag) &&
             (iVar8 = *JVar17.ptr, *(int *)JVar17.ptr = iVar8 + -1, iVar8 < 2)) {
            __JS_FreeValueRT(local_80->rt,this_obj_02);
          }
LAB_00133c05:
          this_obj_02 = (JSValue)(ZEXT816(6) << 0x40);
          uVar14 = 0;
          uVar15 = uVar18;
        }
      }
      else {
        JVar17 = (JSValueUnion)(argv->u).ptr;
        JVar23 = js_create_from_ctor(ctx,new_target,classid);
        JVar10 = JVar23.u;
        if ((int)JVar23.tag != 6) {
          in_stack_ffffffffffffff48 = 0;
          obj.tag = uVar18;
          obj.u.ptr = JVar17.ptr;
          this_obj_03.tag = uVar18;
          this_obj_03.u.ptr = JVar17.ptr;
          local_88 = (double)JVar23.tag;
          JVar23 = JS_GetPropertyInternal(ctx,obj,0xc6,this_obj_03,0);
          uVar15 = 3;
          if ((int)JVar23.tag - 2U < 2) {
            obj_04.tag = uVar18;
            obj_04.u.ptr = JVar17.ptr;
            iVar8 = js_get_length64(ctx,(int64_t *)&local_70,obj_04);
            if (iVar8 == 0) {
              *(int *)JVar17.ptr = *JVar17.ptr + 1;
              uVar15 = uVar18;
              local_78 = JVar17;
LAB_00133b34:
              dVar13 = local_88;
              local_60.ptr = local_70;
              in_stack_ffffffffffffff48 = 0x133348;
              in_stack_ffffffffffffff4c = 0;
              JVar23 = js_array_buffer_constructor3
                                 (ctx,(JSValue)(ZEXT816(3) << 0x40),(long)local_70 << (bVar1 & 0x3f)
                                  ,0x13,(uint8_t *)0x0,js_array_buffer_free,(void *)0x0,1);
              JVar6 = local_60;
              JVar17 = local_78;
              uVar18 = uVar15;
              if ((int)JVar23.tag != 6) {
                obj_01.tag = (int64_t)JVar23.u.ptr;
                obj_01.u.ptr = JVar10.ptr;
                buffer.tag = 0;
                buffer.u = (JSValueUnion)JVar23.tag;
                iVar8 = typed_array_init(ctx,obj_01,buffer,(uint64_t)local_60,
                                         CONCAT44(in_stack_ffffffffffffff4c,
                                                  in_stack_ffffffffffffff48));
                ctx_00 = local_80;
                JVar17 = local_78;
                JVar20.tag = JVar6;
                if (iVar8 == 0) {
                  if (0 < (long)JVar6.ptr) {
                    iVar8 = 1;
                    JVar17.float64 = 0.0;
                    do {
                      local_58 = CONCAT44(local_58._4_4_,iVar8);
                      uVar9 = iVar8 - 1;
                      JVar20.tag = (double)uVar9;
                      if (-1 < (int)uVar9) {
                        JVar20.tag = JVar17;
                      }
                      iVar16 = 7;
                      if (-1 < (int)uVar9) {
                        iVar16 = 0;
                      }
                      this_obj.tag = uVar15;
                      this_obj.u.ptr = local_78.ptr;
                      prop.tag = iVar16;
                      prop.u.float64 = JVar20.tag;
                      JVar23 = JS_GetPropertyValue(ctx_00,this_obj,prop);
                      JVar17 = local_78;
                      ctx = ctx_00;
                      dVar13 = local_88;
                      if ((int)JVar23.tag == 6) goto LAB_00133bac;
                      in_stack_ffffffffffffff48 = JVar23.u._0_4_;
                      in_stack_ffffffffffffff4c = JVar23.u._4_4_;
                      this_obj_00.tag = (int64_t)local_88;
                      this_obj_00.u.ptr = JVar10.ptr;
                      prop_00.tag = iVar16;
                      prop_00.u.float64 = JVar20.tag;
                      local_98 = (JSValueUnion  [2])JVar23;
                      iVar8 = JS_SetPropertyValue(ctx_00,this_obj_00,prop_00,JVar23,0x4000);
                      JVar17 = local_78;
                      ctx = local_80;
                      dVar13 = local_88;
                      if (iVar8 < 0) goto LAB_00133bac;
                      JVar17.ptr = (void *)(local_58 & 0xffffffff);
                      iVar8 = (int)local_58 + 1;
                      JVar20.tag = local_60;
                    } while ((long)JVar17.ptr < (long)local_60.ptr);
                  }
                  v_01.tag = uVar15;
                  v_01.u.ptr = local_78.ptr;
                  JS_FreeValue(local_80,v_01);
                  uVar14 = (ulong)JVar10.ptr & 0xffffffff00000000;
                  this_obj_02.tag = (int64_t)local_88;
                  this_obj_02.u.ptr = JVar10.ptr;
                  goto LAB_00133c0a;
                }
              }
            }
            else {
              uVar15 = 3;
              JVar17.float64 = 0.0;
              dVar13 = local_88;
            }
          }
          else if ((int)JVar23.tag == 6) {
            JVar17.float64 = 0.0;
            dVar13 = local_88;
          }
          else {
            obj_05.tag = uVar18;
            obj_05.u.ptr = JVar17.ptr;
            JVar21 = js_array_from_iterator(ctx,(uint32_t *)&local_98[0].int32,obj_05,JVar23);
            uVar15 = JVar21.tag;
            local_78 = JVar21.u;
            JS_FreeValue(ctx,JVar23);
            JVar17 = local_78;
            dVar13 = local_88;
            uVar18 = uVar15;
            if ((int)JVar21.tag != 6) {
              local_70 = (int *)(ulong)(uint)local_98[0]._0_4_;
              goto LAB_00133b34;
            }
          }
LAB_00133bac:
          if ((0xfffffff4 < (uint)uVar15) &&
             (iVar8 = *JVar17.ptr, *(int *)JVar17.ptr = iVar8 + -1, iVar8 < 2)) {
            v.tag = uVar15;
            v.u.ptr = JVar17.ptr;
            local_98[0] = JVar17;
            __JS_FreeValueRT(ctx->rt,v);
          }
          local_98[0].ptr = JVar10.ptr;
          if ((0xfffffff4 < SUB84(dVar13,0)) &&
             (iVar8 = *JVar10.ptr, *(int *)JVar10.ptr = iVar8 + -1, iVar8 < 2)) {
            v_00.tag = (int64_t)dVar13;
            v_00.u.ptr = JVar10.ptr;
            __JS_FreeValueRT(ctx->rt,v_00);
          }
          goto LAB_00133c05;
        }
        uVar14 = 0;
        this_obj_02 = (JSValue)(ZEXT816(6) << 0x40);
      }
LAB_00133c0a:
      iVar16 = this_obj_02.tag;
      JVar17.float64 = this_obj_02.u.float64 | uVar14;
      uVar14 = uVar14 >> 0x20;
      bVar5 = false;
    }
LAB_00133c13:
    JVar21.tag = iVar16;
    JVar21.u.float64 = JVar17.float64;
    JVar19.tag = uVar15;
    JVar19.u.float64 = JVar20.tag;
    ctx = local_80;
    if (!bVar5) goto LAB_00133cc4;
  }
  else {
    JVar23.tag = uVar18;
    JVar23.u.ptr = (argv->u).ptr;
    iVar8 = JS_ToIndex(ctx,(uint64_t *)&local_70,JVar23);
    if (iVar8 != 0) {
      JVar21 = (JSValue)(ZEXT816(6) << 0x40);
      goto LAB_00133cc4;
    }
    in_stack_ffffffffffffff48 = 0x133348;
    in_stack_ffffffffffffff4c = 0;
    JVar21 = (JSValue)(ZEXT816(6) << 0x40);
    JVar19 = js_array_buffer_constructor3
                       (ctx,(JSValue)(ZEXT816(3) << 0x40),(long)local_70 << (bVar1 & 0x3f),0x13,
                        (uint8_t *)0x0,js_array_buffer_free,(void *)0x0,1);
    if ((int)JVar19.tag == 6) goto LAB_00133cc4;
    local_50 = 0;
  }
  JVar17 = JVar19.u;
  ctor.tag = local_38;
  ctor.u.float64 = local_40.float64;
  JVar21 = js_create_from_ctor(ctx,ctor,local_64);
  JVar20.tag = JVar21.u;
  if ((uint)JVar21.tag == 6) {
    local_98[0].ptr = JVar17.ptr;
    if ((0xfffffff4 < (uint)JVar19.tag) &&
       (iVar8 = *JVar17.ptr, *(int *)JVar17.ptr = iVar8 + -1, iVar8 < 2)) {
      rt = ctx->rt;
      JVar21 = JVar19;
LAB_00133cb6:
      __JS_FreeValueRT(rt,JVar21);
    }
  }
  else {
    obj_02.tag = (int64_t)JVar17.ptr;
    obj_02.u.ptr = JVar20.tag;
    buffer_00.tag = local_50;
    buffer_00.u = (JSValueUnion)(JSValueUnion)JVar19.tag;
    iVar8 = typed_array_init(ctx,obj_02,buffer_00,(uint64_t)local_70,
                             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    if (iVar8 == 0) {
      uVar14 = (ulong)JVar20.tag >> 0x20;
      goto LAB_00133cc4;
    }
    local_98[0].ptr = JVar20.tag;
    if ((0xfffffff4 < (uint)JVar21.tag) &&
       (iVar8 = *JVar20.tag, *(int *)JVar20.tag = iVar8 + -1, iVar8 < 2)) {
      rt = ctx->rt;
      goto LAB_00133cb6;
    }
  }
  JVar21 = (JSValue)(ZEXT816(6) << 0x40);
LAB_00133cc4:
  JVar22.u.ptr = (void *)((ulong)JVar21.u.ptr & 0xffffffff | uVar14 << 0x20);
  JVar22.tag = JVar21.tag;
  return JVar22;
}

Assistant:

static JSValue js_typed_array_constructor(JSContext *ctx,
                                          JSValueConst new_target,
                                          int argc, JSValueConst *argv,
                                          int classid)
{
    JSValue buffer, obj;
    JSArrayBuffer *abuf;
    int size_log2;
    uint64_t len, offset;

    size_log2 = typed_array_size_log2(classid);
    if (JS_VALUE_GET_TAG(argv[0]) != JS_TAG_OBJECT) {
        if (JS_ToIndex(ctx, &len, argv[0]))
            return JS_EXCEPTION;
        buffer = js_array_buffer_constructor1(ctx, JS_UNDEFINED,
                                              len << size_log2);
        if (JS_IsException(buffer))
            return JS_EXCEPTION;
        offset = 0;
    } else {
        JSObject *p = JS_VALUE_GET_OBJ(argv[0]);
        if (p->class_id == JS_CLASS_ARRAY_BUFFER ||
            p->class_id == JS_CLASS_SHARED_ARRAY_BUFFER) {
            abuf = p->u.array_buffer;
            if (JS_ToIndex(ctx, &offset, argv[1]))
                return JS_EXCEPTION;
            if (abuf->detached)
                return JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
            if ((offset & ((1 << size_log2) - 1)) != 0 ||
                offset > abuf->byte_length)
                return JS_ThrowRangeError(ctx, "invalid offset");
            if (JS_IsUndefined(argv[2])) {
                if ((abuf->byte_length & ((1 << size_log2) - 1)) != 0)
                    goto invalid_length;
                len = (abuf->byte_length - offset) >> size_log2;
            } else {
                if (JS_ToIndex(ctx, &len, argv[2]))
                    return JS_EXCEPTION;
                if (abuf->detached)
                    return JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
                if ((offset + (len << size_log2)) > abuf->byte_length) {
                invalid_length:
                    return JS_ThrowRangeError(ctx, "invalid length");
                }
            }
            buffer = JS_DupValue(ctx, argv[0]);
        } else {
            if (p->class_id >= JS_CLASS_UINT8C_ARRAY &&
                p->class_id <= JS_CLASS_FLOAT64_ARRAY) {
                return js_typed_array_constructor_ta(ctx, new_target, argv[0], classid);
            } else {
                return js_typed_array_constructor_obj(ctx, new_target, argv[0], classid);
            }
        }
    }

    obj = js_create_from_ctor(ctx, new_target, classid);
    if (JS_IsException(obj)) {
        JS_FreeValue(ctx, buffer);
        return JS_EXCEPTION;
    }
    if (typed_array_init(ctx, obj, buffer, offset, len)) {
        JS_FreeValue(ctx, obj);
        return JS_EXCEPTION;
    }
    return obj;
}